

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

void RegisterMiningRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  string category_01;
  string category_02;
  string category_03;
  string category_04;
  string category_05;
  string category_06;
  string category_07;
  string category_08;
  string category_09;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe68;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffe70;
  long in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterMiningRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterMiningRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"mining","");
      category._M_string_length = in_stack_fffffffffffffe70;
      category._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands,category,(RpcMethodFnType)local_58);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"mining","");
      category_00._M_string_length = in_stack_fffffffffffffe70;
      category_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_00.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_00.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 1,category_00,(RpcMethodFnType)local_78);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"mining","");
      category_01._M_string_length = in_stack_fffffffffffffe70;
      category_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_01.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_01.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 2,category_01,(RpcMethodFnType)local_98);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"mining","");
      category_02._M_string_length = in_stack_fffffffffffffe70;
      category_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_02.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_02.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 3,category_02,(RpcMethodFnType)local_b8);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"mining","");
      category_03._M_string_length = in_stack_fffffffffffffe70;
      category_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_03.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_03.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 4,category_03,(RpcMethodFnType)local_d8);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"mining","");
      category_04._M_string_length = in_stack_fffffffffffffe70;
      category_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_04.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_04.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 5,category_04,(RpcMethodFnType)local_f8);
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"mining","");
      category_05._M_string_length = in_stack_fffffffffffffe70;
      category_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_05.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_05.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 6,category_05,(RpcMethodFnType)local_118);
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"hidden","");
      category_06._M_string_length = in_stack_fffffffffffffe70;
      category_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_06.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_06.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 7,category_06,(RpcMethodFnType)local_138);
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"hidden","");
      category_07._M_string_length = in_stack_fffffffffffffe70;
      category_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_07.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_07.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 8,category_07,(RpcMethodFnType)local_158);
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"hidden","");
      category_08._M_string_length = in_stack_fffffffffffffe70;
      category_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
      category_08.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_08.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 9,category_08,(RpcMethodFnType)local_178);
      puVar3 = &stack0xfffffffffffffe78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffe68,"hidden","");
      category_09._M_string_length = in_stack_fffffffffffffe70;
      category_09._M_dataplus._M_p = puVar3;
      category_09.field_2._M_allocated_capacity = in_stack_fffffffffffffe78;
      category_09.field_2._8_8_ = in_stack_fffffffffffffe80;
      CRPCCommand::CRPCCommand
                (RegisterMiningRPCCommands::commands + 10,category_09,
                 (RpcMethodFnType)&stack0xfffffffffffffe68);
      if (puVar3 != &stack0xfffffffffffffe78) {
        operator_delete(puVar3,in_stack_fffffffffffffe78 + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0],local_148[0] + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterMiningRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0x580;
  pcmd = RegisterMiningRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterMiningRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"mining", &getnetworkhashps},
        {"mining", &getmininginfo},
        {"mining", &prioritisetransaction},
        {"mining", &getprioritisedtransactions},
        {"mining", &getblocktemplate},
        {"mining", &submitblock},
        {"mining", &submitheader},

        {"hidden", &generatetoaddress},
        {"hidden", &generatetodescriptor},
        {"hidden", &generateblock},
        {"hidden", &generate},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}